

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChInertiaUtils.h
# Opt level: O0

void chrono::ChInertiaUtils::PrincipalInertia
               (ChMatrix33<double> *inertia,ChVector<double> *principal_inertia,
               ChMatrix33<double> *principal_axes)

{
  Scalar SVar1;
  ColXpr local_70;
  Scalar local_40;
  undefined1 local_38 [8];
  ChVectorN<double,_3> principal_I;
  ChMatrix33<double> *principal_axes_local;
  ChVector<double> *principal_inertia_local;
  ChMatrix33<double> *inertia_local;
  
  principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (double)principal_axes;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_38);
  ChMatrix33<double>::SelfAdjointEigenSolve
            (inertia,(ChMatrix33<double> *)
                     principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2],(ChVectorN<double,_3> *)local_38);
  SVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                     principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2]);
  if (SVar1 < 0.0) {
    local_40 = -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::col
              (&local_70,
               (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
               principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2],0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_> *)
               &local_70,&local_40);
  }
  ChVector<double>::operator=
            (principal_inertia,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_38);
  return;
}

Assistant:

static void PrincipalInertia(const ChMatrix33<>& inertia,
                                 ChVector<>& principal_inertia,
                                 ChMatrix33<>& principal_axes) {
        ChVectorN<double, 3> principal_I;
        inertia.SelfAdjointEigenSolve(principal_axes, principal_I);

        // Ensure the principal_axes represent a proper rotation matrix.
        // If the determinant is -1, flip the sign of one of the eigenvectors to obtain a proper rotation
        // (i.e. a transformation representing a right-handed rotation)
        if (principal_axes.determinant() < 0) {
            principal_axes.col(0) *= -1;
        }

        // Return the principal moments of inertia in a ChVector
        principal_inertia = principal_I;

        // Tests
        ////std::cout << "Input inertia matrix: J\n" << inertia << std::endl;
        ////std::cout << "Principal moments of inertia: I\n" << principal_I << std::endl;
        ////std::cout << "Principal axes: R\n" << principal_axes << std::endl;
        ////std::cout << "det(R) = " << principal_axes.determinant() << std::endl;
        ////std::cout << "Transform back: R * diag(I) * R'\n"
        ////          << principal_axes * ChMatrix33<>(principal_inertia) * principal_axes.transpose() << std::endl;
    }